

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  ImWchar c;
  uint *puVar4;
  uchar *puVar5;
  uint *puVar6;
  ImFont *this;
  uint uVar7;
  ImFontAtlasCustomRect *pIVar8;
  ImFont **ppIVar9;
  ImFontGlyph *pIVar10;
  ulong uVar11;
  ulong uVar12;
  ImVector<ImFont_*> *this_00;
  int i;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  unsigned_short uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  int i_1;
  uint uVar22;
  float fVar23;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec4 *local_40;
  long local_38;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xace,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar8 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar3 = pIVar8->X;
  if (uVar3 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xa5d,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar8->Width != 0xd9) || (pIVar8->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa63,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar8->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar8->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar8->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar8->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar8->Width != 2) || (pIVar8->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa74,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar14 = atlas->TexWidth;
    iVar15 = (uint)pIVar8->Y * iVar14 + (uint)uVar3;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar4 = atlas->TexPixelsRGBA32;
      puVar6 = puVar4 + (iVar14 + iVar15);
      puVar6[0] = 0xffffffff;
      puVar6[1] = 0xffffffff;
      puVar4 = puVar4 + iVar15;
      puVar4[0] = 0xffffffff;
      puVar4[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar14 + iVar15) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar14 + iVar15] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar15 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar15] = 0xff;
    }
  }
  uVar18._0_2_ = pIVar8->X;
  uVar18._2_2_ = pIVar8->Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar18 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar18 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar8 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar17 = pIVar8->X;
    if (uVar17 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                    ,0xa89,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_40 = atlas->TexUvLines;
    lVar13 = 0;
    iVar14 = 0;
    iVar15 = 0;
    uVar16 = 0;
    while (uVar16 != 0x40) {
      if (pIVar8->Height <= uVar16) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0xa93,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar18 = (uint)pIVar8->Width;
      puVar5 = atlas->TexPixelsAlpha8;
      uVar22 = (uint)uVar17;
      if (puVar5 == (uchar *)0x0) {
        puVar6 = atlas->TexPixelsRGBA32;
        uVar20 = (uint)pIVar8->Y;
        uVar21 = (ulong)((iVar14 + uVar20) * atlas->TexWidth + uVar22);
        uVar7 = iVar15 + uVar18 >> 1;
        uVar11 = (ulong)uVar7;
        for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          puVar6[uVar21 + uVar12] = 0;
        }
        for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
          puVar6[uVar11 + uVar21 + uVar12] = 0xffffffff;
        }
        for (uVar12 = 0; local_38 = lVar13, (iVar15 + uVar18) - uVar7 != uVar12; uVar12 = uVar12 + 1
            ) {
          *(undefined4 *)((long)puVar6 + uVar12 * 4 + lVar13 + uVar11 * 4 + uVar21 * 4) = 0;
        }
      }
      else {
        uVar21 = (ulong)(((uint)pIVar8->Y + iVar14) * atlas->TexWidth + uVar22);
        uVar22 = iVar15 + uVar18 >> 1;
        uVar12 = (ulong)uVar22;
        for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
          puVar5[uVar11 + uVar21] = '\0';
        }
        for (uVar11 = 0; uVar16 != uVar11; uVar11 = uVar11 + 1) {
          puVar5[uVar11 + uVar21 + uVar12] = 0xff;
        }
        for (uVar11 = 0; (iVar15 + uVar18) - uVar22 != uVar11; uVar11 = uVar11 + 1) {
          puVar5[uVar11 + uVar21 + uVar12 + uVar16] = '\0';
        }
        uVar17 = pIVar8->X;
        uVar22 = (uint)uVar17;
        uVar20 = (uint)pIVar8->Y;
      }
      iVar19 = uVar20 + (int)uVar16;
      uVar18 = uVar18 - (int)uVar16 >> 1;
      fVar1 = (atlas->TexUvScale).x;
      fVar23 = (atlas->TexUvScale).y;
      local_40[uVar16].x = (float)((uVar22 + uVar18) - 1) * fVar1;
      fVar23 = ((float)(iVar19 + 1) * fVar23 + (float)iVar19 * fVar23) * 0.5;
      atlas->TexUvLines[uVar16].y = fVar23;
      atlas->TexUvLines[uVar16].z = fVar1 * (float)(uVar22 + uVar18 + (int)(uVar16 + 1));
      atlas->TexUvLines[uVar16].w = fVar23;
      iVar15 = iVar15 + -1;
      iVar14 = iVar14 + 1;
      lVar13 = lVar13 + 4;
      uVar16 = uVar16 + 1;
    }
  }
  for (iVar14 = 0; iVar14 < (atlas->CustomRects).Size; iVar14 = iVar14 + 1) {
    pIVar8 = ImVector<ImFontAtlasCustomRect>::operator[](&atlas->CustomRects,iVar14);
    if ((pIVar8->Font != (ImFont *)0x0) && (pIVar8->GlyphID != 0)) {
      if (pIVar8->Font->ContainerAtlas != atlas) {
        __assert_fail("r->Font->ContainerAtlas == atlas",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0xada,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
      }
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_50.x = 0.0;
      local_50.y = 0.0;
      ImFontAtlas::CalcCustomRectUV(atlas,pIVar8,&local_48,&local_50);
      fVar1 = (pIVar8->GlyphOffset).x;
      fVar23 = (pIVar8->GlyphOffset).y;
      ImFont::AddGlyph(pIVar8->Font,(ImFontConfig *)0x0,(ImWchar)pIVar8->GlyphID,fVar1,fVar23,
                       (float)pIVar8->Width + fVar1,(float)pIVar8->Height + fVar23,local_48.x,
                       local_48.y,local_50.x,local_50.y,pIVar8->GlyphAdvanceX);
    }
  }
  this_00 = &atlas->Fonts;
  for (iVar14 = 0; iVar15 = this_00->Size, iVar14 < iVar15; iVar14 = iVar14 + 1) {
    ppIVar9 = ImVector<ImFont_*>::operator[](this_00,iVar14);
    if ((*ppIVar9)->DirtyLookupTables == true) {
      ppIVar9 = ImVector<ImFont_*>::operator[](this_00,iVar14);
      ImFont::BuildLookupTable(*ppIVar9);
    }
  }
  iVar14 = 0;
  do {
    if (iVar15 <= iVar14) {
      return;
    }
    ppIVar9 = ImVector<ImFont_*>::operator[](this_00,iVar14);
    this = *ppIVar9;
    if (this->EllipsisChar == 0xffff) {
      lVar13 = 0;
      do {
        if (lVar13 == 4) goto LAB_001588e2;
        c = *(ImWchar *)((long)&DAT_002a69dc + lVar13);
        pIVar10 = ImFont::FindGlyphNoFallback(this,c);
        lVar13 = lVar13 + 2;
      } while (pIVar10 == (ImFontGlyph *)0x0);
      this->EllipsisChar = c;
    }
LAB_001588e2:
    iVar14 = iVar14 + 1;
    iVar15 = this_00->Size;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}